

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Dfa::Nfa_to_Dfa(Dfa *this,Nfa *nfa)

{
  size_t *this_00;
  value_type pFVar1;
  bool bVar2;
  reference ppFVar3;
  mapped_type_conflict *pmVar4;
  Fa_Node *pFVar5;
  reference pcVar6;
  set<int,_std::less<int>,_std::allocator<int>_> *this_01;
  reference pEVar7;
  reference piVar8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar9;
  int local_190;
  int i_3;
  int j_1;
  iterator __end4_1;
  iterator __begin4_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range4_1;
  _Self local_168;
  _Base_ptr local_160;
  undefined1 local_158;
  undefined8 local_150;
  Edge k;
  iterator __end4;
  iterator __begin4;
  vector<Edge,_std::allocator<Edge>_> *__range4;
  iterator iStack_120;
  int j;
  iterator __end3;
  iterator __begin3;
  set<int,_std::less<int>,_std::allocator<int>_> *__range3;
  iterator iStack_100;
  char i_2;
  iterator __end2;
  iterator __begin2;
  set<char,_std::less<char>,_std::allocator<char>_> *__range2;
  iterator iStack_e0;
  int i_1;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  value_type_conflict1 local_b8;
  byte local_b2;
  byte local_b1;
  int i;
  bool end_flag;
  bool strat_flag;
  Fa_Node *tp_Node;
  Node_num tp_num;
  int local_70;
  int now;
  int tot;
  undefined1 local_60 [8];
  map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_> trans;
  vector<Node_num,_std::allocator<Node_num>_> num;
  Nfa *nfa_local;
  Dfa *this_local;
  
  std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::clear(&this->Node);
  std::vector<bool,_std::allocator<bool>_>::clear(&this->used);
  std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::clear(&this->begin);
  std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::clear(&this->end);
  std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::resize(&this->Node,1);
  this_00 = &trans._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<Node_num,_std::allocator<Node_num>_>::vector
            ((vector<Node_num,_std::allocator<Node_num>_> *)this_00);
  std::map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>::
  map((map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_> *)
      local_60);
  std::vector<Node_num,_std::allocator<Node_num>_>::resize
            ((vector<Node_num,_std::allocator<Node_num>_> *)this_00,1);
  tp_num.n._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  Node_num::Node_num((Node_num *)&tp_Node);
  local_b1 = 0;
  local_b2 = 0;
  for (local_b8 = 1; local_b8 <= nfa->n; local_b8 = local_b8 + 1) {
    ppFVar3 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                        (&nfa->Node,(long)local_b8);
    if (((*ppFVar3)->start & 1U) != 0) {
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&tp_Node,&local_b8);
    }
  }
  pmVar4 = std::
           map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
           ::operator[]((map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                         *)local_60,(key_type *)&tp_Node);
  *pmVar4 = 1;
  std::vector<Node_num,_std::allocator<Node_num>_>::push_back
            ((vector<Node_num,_std::allocator<Node_num>_> *)
             &trans._M_t._M_impl.super__Rb_tree_header._M_node_count,(value_type *)&tp_Node);
  local_b1 = 0;
  local_b2 = 0;
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&tp_Node);
  iStack_e0 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&tp_Node);
  while (bVar2 = std::operator!=(&__end1,&stack0xffffffffffffff20), bVar2) {
    piVar8 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    ppFVar3 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                        (&nfa->Node,(long)*piVar8);
    if (((*ppFVar3)->end & 1U) != 0) {
      local_b2 = 1;
    }
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  local_b1 = 1;
  pFVar5 = (Fa_Node *)operator_new(0x28);
  Fa_Node::Fa_Node(pFVar5,1,(bool)(local_b1 & 1),(bool)(local_b2 & 1));
  _i = pFVar5;
  std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back(&this->Node,(value_type *)&i);
  local_70 = 2;
  for (; tp_num.n._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < local_70;
      tp_num.n._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           tp_num.n._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    __end2 = std::set<char,_std::less<char>,_std::allocator<char>_>::begin(&all_char);
    iStack_100 = std::set<char,_std::less<char>,_std::allocator<char>_>::end(&all_char);
    while (bVar2 = std::operator!=(&__end2,&stack0xffffffffffffff00), bVar2) {
      pcVar6 = std::_Rb_tree_const_iterator<char>::operator*(&__end2);
      __range3._7_1_ = *pcVar6;
      if (__range3._7_1_ != '\0') {
        std::set<int,_std::less<int>,_std::allocator<int>_>::clear
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)&tp_Node);
        this_01 = &std::vector<Node_num,_std::allocator<Node_num>_>::operator[]
                             ((vector<Node_num,_std::allocator<Node_num>_> *)
                              &trans._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (long)tp_num.n._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_)
                   ->n;
        __end3 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_01);
        iStack_120 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(this_01);
        while (bVar2 = std::operator!=(&__end3,&stack0xfffffffffffffee0), bVar2) {
          piVar8 = std::_Rb_tree_const_iterator<int>::operator*(&__end3);
          ppFVar3 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                              (&nfa->Node,(long)*piVar8);
          pFVar1 = *ppFVar3;
          __end4 = std::vector<Edge,_std::allocator<Edge>_>::begin(&pFVar1->edge);
          k.v = (Fa_Node *)std::vector<Edge,_std::allocator<Edge>_>::end(&pFVar1->edge);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                                             *)&k.v), bVar2) {
            pEVar7 = __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                     ::operator*(&__end4);
            local_150 = *(undefined8 *)pEVar7;
            k._0_8_ = pEVar7->v;
            if ((char)local_150 == __range3._7_1_) {
              pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                ((set<int,_std::less<int>,_std::allocator<int>_> *)&tp_Node,
                                 (value_type_conflict1 *)k._0_8_);
              local_160 = (_Base_ptr)pVar9.first._M_node;
              local_158 = pVar9.second;
            }
            __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
            operator++(&__end4);
          }
          std::_Rb_tree_const_iterator<int>::operator++(&__end3);
        }
        bVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&tp_Node);
        if (!bVar2) {
          local_168._M_node =
               (_Base_ptr)
               std::
               map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
               ::find((map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                       *)local_60,(key_type *)&tp_Node);
          __range4_1 = (set<int,_std::less<int>,_std::allocator<int>_> *)
                       std::
                       map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                       ::end((map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                              *)local_60);
          bVar2 = std::operator!=(&local_168,(_Self *)&__range4_1);
          if (bVar2) {
            ppFVar3 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                (&this->Node,
                                 (long)tp_num.n._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                       _4_4_);
            pFVar1 = *ppFVar3;
            pmVar4 = std::
                     map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                     ::operator[]((map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                                   *)local_60,(key_type *)&tp_Node);
            ppFVar3 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                (&this->Node,(long)*pmVar4);
            std::vector<Edge,std::allocator<Edge>>::emplace_back<Fa_Node*&,char&>
                      ((vector<Edge,std::allocator<Edge>> *)&pFVar1->edge,ppFVar3,
                       (char *)((long)&__range3 + 7));
          }
          else {
            pmVar4 = std::
                     map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                     ::operator[]((map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                                   *)local_60,(key_type *)&tp_Node);
            *pmVar4 = local_70;
            std::vector<Node_num,_std::allocator<Node_num>_>::push_back
                      ((vector<Node_num,_std::allocator<Node_num>_> *)
                       &trans._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (value_type *)&tp_Node);
            local_b1 = 0;
            local_b2 = 0;
            __end4_1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                                 ((set<int,_std::less<int>,_std::allocator<int>_> *)&tp_Node);
            _i_3 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)&tp_Node);
            while (bVar2 = std::operator!=(&__end4_1,(_Self *)&i_3), bVar2) {
              piVar8 = std::_Rb_tree_const_iterator<int>::operator*(&__end4_1);
              ppFVar3 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                  (&nfa->Node,(long)*piVar8);
              if (((*ppFVar3)->end & 1U) != 0) {
                local_b2 = 1;
              }
              std::_Rb_tree_const_iterator<int>::operator++(&__end4_1);
            }
            pFVar5 = (Fa_Node *)operator_new(0x28);
            Fa_Node::Fa_Node(pFVar5,local_70,(bool)(local_b1 & 1),(bool)(local_b2 & 1));
            _i = pFVar5;
            std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back
                      (&this->Node,(value_type *)&i);
            ppFVar3 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                (&this->Node,
                                 (long)tp_num.n._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                       _4_4_);
            std::vector<Edge,std::allocator<Edge>>::emplace_back<Fa_Node*&,char&>
                      ((vector<Edge,std::allocator<Edge>> *)&(*ppFVar3)->edge,(Fa_Node **)&i,
                       (char *)((long)&__range3 + 7));
            local_70 = local_70 + 1;
          }
        }
      }
      std::_Rb_tree_const_iterator<char>::operator++(&__end2);
    }
  }
  this->n = local_70 + -1;
  for (local_190 = 1; local_190 <= this->n; local_190 = local_190 + 1) {
    ppFVar3 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                        (&this->Node,(long)local_190);
    if (((*ppFVar3)->start & 1U) != 0) {
      ppFVar3 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                          (&this->Node,(long)local_190);
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back(&this->begin,ppFVar3);
    }
    ppFVar3 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                        (&this->Node,(long)local_190);
    if (((*ppFVar3)->end & 1U) != 0) {
      ppFVar3 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                          (&this->Node,(long)local_190);
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back(&this->end,ppFVar3);
    }
  }
  Node_num::~Node_num((Node_num *)&tp_Node);
  std::map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>::
  ~map((map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_> *)
       local_60);
  std::vector<Node_num,_std::allocator<Node_num>_>::~vector
            ((vector<Node_num,_std::allocator<Node_num>_> *)
             &trans._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void Dfa::Nfa_to_Dfa(Nfa &nfa) {//NFA -> DFA
    //DFA Node and used vector

    Node.clear();
    used.clear();
    begin.clear();
    end.clear();

    Node.resize(1);

    vector<Node_num> num;
    map<Node_num, int> trans;
    //DFA Node num trans to NFA Node num

    num.resize(1);

    int tot = 1;
    int now = 1;

    Node_num tp_num;
    Fa_Node *tp_Node;
    bool strat_flag = false, end_flag = false;

    //find start Node
    for (int i = 1; i <= nfa.n; i++) {
        if (nfa.Node[i]->start) {
            tp_num.n.insert(i);
        }
    }

    //insert start Node
    trans[tp_num] = tot;
    num.push_back(tp_num);
    strat_flag = false, end_flag = false;
    for (auto i:tp_num.n) {
        if (nfa.Node[i]->end) {
            end_flag = true;
        }
    }
    strat_flag = true;
    tp_Node = new Fa_Node(tot, strat_flag, end_flag);
    Node.push_back(tp_Node);

    tot++;
    while (now < tot) {
        for (auto i:all_char) {// char
            if (i == '\0') {
                continue;
            }
            tp_num.n.clear();
            for (auto j:num[now].n) {// NFA Node num
                for (auto k:nfa.Node[j]->edge) {//Node edge
                    if (k.c == i) {
                        tp_num.n.insert(k.v->n);
                        continue;
                    }
                }
            }
            if (tp_num.n.empty()) {// edge does not exist
                continue;
            }
            if (trans.find(tp_num) != trans.end()) {// Node has been created
                Node[now]->edge.emplace_back(Node[trans[tp_num]], i);
            } else {// creat Node
                trans[tp_num] = tot;
                num.push_back(tp_num);
                strat_flag = false, end_flag = false;
                for (auto j:tp_num.n) {
                    if (nfa.Node[j]->end) {
                        end_flag = true;
                    }
                }
                tp_Node = new Fa_Node(tot, strat_flag, end_flag);
                Node.push_back(tp_Node);

                Node[now]->edge.emplace_back(tp_Node, i);
                tot++;
            }
        }
        now++;
    }

    //update n  begin   end
    n = tot - 1;
    for (int i = 1; i <= n; i++) {
        if (Node[i]->start) {
            begin.push_back(Node[i]);
        }
        if (Node[i]->end) {
            end.push_back(Node[i]);
        }
    }
}